

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteTailCallExports(CWriter *this,CWriterPhase kind)

{
  Export *this_00;
  bool bVar1;
  vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *this_01;
  reference ppEVar2;
  char *pcVar3;
  string_view sVar4;
  undefined1 auVar5 [16];
  Newline local_cb;
  CloseBrace local_ca;
  Newline local_c9;
  TailCallRef local_c8;
  Func *local_b8;
  Func *func_1;
  undefined1 local_a8 [16];
  string local_98;
  Newline local_71;
  string_view local_70;
  undefined1 local_60 [8];
  string mangled_name;
  Func *func;
  Export *export_;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *__range2;
  CWriterPhase kind_local;
  CWriter *this_local;
  
  this_01 = &this->module_->exports;
  __end2 = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::begin(this_01);
  export_ = (Export *)std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                                *)&export_);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppEVar2;
    if (this_00->kind == First) {
      mangled_name.field_2._8_8_ = Module::GetFunc(this->module_,&this_00->var);
      bVar1 = IsImport(this,(string *)mangled_name.field_2._8_8_);
      if ((bVar1) || ((*(byte *)(mangled_name.field_2._8_8_ + 0x128) & 1) != 0)) {
        sVar4 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
        pcVar3 = sVar4._M_str;
        local_70 = sVar4;
        (anonymous_namespace)::CWriter::TailCallExportName_abi_cxx11_
                  ((string *)local_60,(CWriter *)this,sVar4);
        auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
        sVar4._M_len = auVar5._8_8_;
        sVar4._M_str = pcVar3;
        local_a8 = auVar5;
        (anonymous_namespace)::SanitizeForComment_abi_cxx11_(&local_98,auVar5._0_8_,sVar4);
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::Newline,char_const(&)[29],std::__cxx11::string,char_const(&)[5],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,&local_71,(char (*) [29])"/* export for tail-call of \'",
                   &local_98,(char (*) [5])"\' */",(Newline *)((long)&func_1 + 7));
        std::__cxx11::string::~string((string *)&local_98);
        if (kind == Declarations) {
          WriteTailCallFuncDeclaration(this,(string *)local_60);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [2])0x37ca1e,(Newline *)((long)&func_1 + 6));
        }
        else {
          WriteTailCallFuncDeclaration(this,(string *)local_60);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
                    ((CWriter *)this,(char (*) [2])0x36dfa4,(OpenBrace *)((long)&func_1 + 5));
          local_b8 = Module::GetFunc(this->module_,&this_00->var);
          TailCallRef::TailCallRef(&local_c8,&local_b8->name);
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::TailCallRef,char_const(&)[39],wabt::(anonymous_namespace)::Newline,wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,&local_c8,
                     (char (*) [39])"(instance_ptr, tail_call_stack, next);",&local_c9,&local_ca,
                     &local_cb);
        }
        std::__cxx11::string::~string((string *)local_60);
      }
    }
    __gnu_cxx::
    __normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void CWriter::WriteTailCallExports(CWriterPhase kind) {
  for (const Export* export_ : module_->exports) {
    if (export_->kind != ExternalKind::Func) {
      continue;
    }

    const Func* func = module_->GetFunc(export_->var);

    if (!IsImport(func->name) && !func->features_used.tailcall) {
      continue;
    }

    const std::string mangled_name = TailCallExportName(export_->name);

    Write(Newline(), "/* export for tail-call of '",
          SanitizeForComment(export_->name), "' */", Newline());
    if (kind == CWriterPhase::Declarations) {
      WriteTailCallFuncDeclaration(mangled_name);
      Write(";", Newline());
    } else {
      WriteTailCallFuncDeclaration(mangled_name);
      Write(" ", OpenBrace());
      const Func* func = module_->GetFunc(export_->var);
      Write(TailCallRef(func->name), "(instance_ptr, tail_call_stack, next);",
            Newline(), CloseBrace(), Newline());
    }
  }
}